

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

void __thiscall
FOptionMenuSliderBase::FOptionMenuSliderBase
          (FOptionMenuSliderBase *this,char *label,double min,double max,double step,int showval)

{
  FName local_38;
  int local_34;
  double dStack_30;
  int showval_local;
  double step_local;
  double max_local;
  double min_local;
  char *label_local;
  FOptionMenuSliderBase *this_local;
  
  local_34 = showval;
  dStack_30 = step;
  step_local = max;
  max_local = min;
  min_local = (double)label;
  label_local = (char *)this;
  FName::FName(&local_38,NAME_None);
  FOptionMenuItem::FOptionMenuItem(&this->super_FOptionMenuItem,label,&local_38,false);
  (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
       (_func_int **)&PTR__FOptionMenuSliderBase_009ecc98;
  this->mMin = max_local;
  this->mMax = step_local;
  this->mStep = dStack_30;
  this->mShowValue = local_34;
  this->mDrawX = 0;
  this->mSliderShort = 0;
  return;
}

Assistant:

FOptionMenuSliderBase(const char *label, double min, double max, double step, int showval)
		: FOptionMenuItem(label, NAME_None)
	{
		mMin = min;
		mMax = max;
		mStep = step;
		mShowValue = showval;
		mDrawX = 0;
		mSliderShort = 0;
	}